

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModel>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LinkedModel> *)
             _LinkedModel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinkedModelFile>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LinkedModelFile> *)
           _LinkedModelFile_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinkedModel_default_instance_.Shutdown();
  _LinkedModelFile_default_instance_.Shutdown();
}